

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenInitializer::GetMocBuildPath_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenInitializer *this,MUFile *muf)

{
  string *args;
  char *pcVar1;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  string_view filename;
  cmAlphaNum local_400;
  cmAlphaNum local_3d0;
  string local_3a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_380;
  undefined1 local_378;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_370;
  undefined1 local_368;
  cmAlphaNum local_360;
  cmAlphaNum local_330;
  string local_300;
  unsigned_long local_2e0;
  size_t ii;
  size_t number_end;
  size_t number_begin;
  undefined1 local_2c0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b8;
  undefined1 local_2b0;
  cmAlphaNum local_2a8;
  cmAlphaNum local_278;
  string local_248;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  string local_1c8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a8;
  undefined1 local_1a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_198;
  undefined1 local_190;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  string local_128;
  undefined1 local_108 [16];
  string local_f8;
  cmAlphaNum local_d8;
  string local_98;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string basePath;
  MUFile *muf_local;
  cmQtAutoGenInitializer *this_local;
  string *res;
  
  basePath.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((muf->MocIt & 1U) == 0) {
    basePath.field_2._M_local_buf[0xf] = '\x01';
    basePath.field_2._8_4_ = 1;
  }
  else {
    pcVar1 = (char *)0xa;
    cmFilePathChecksum::getPart(&local_98,&this->PathCheckSum,&muf->FullPath,10);
    cmAlphaNum::cmAlphaNum(&local_78,&local_98);
    cmAlphaNum::cmAlphaNum(&local_d8,"/moc_");
    local_108 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)muf);
    filename._M_len = local_108._8_8_;
    filename._M_str = pcVar1;
    cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_(&local_f8,local_108._0_8_,filename);
    cmStrCat<std::__cxx11::string>((string *)local_48,&local_78,&local_d8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    cmAlphaNum::cmAlphaNum(&local_158,(string *)local_48);
    cmAlphaNum::cmAlphaNum(&local_188,".cpp");
    cmStrCat<>(&local_128,&local_158,&local_188);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    pVar2 = std::
            unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::emplace<std::__cxx11::string&>
                      ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->Moc).EmittedBuildPaths,__return_storage_ptr__);
    local_1a8._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_1a0 = pVar2.second;
    local_198._M_cur = local_1a8._M_cur;
    local_190 = local_1a0;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      cmAlphaNum::cmAlphaNum(&local_1f8,(string *)local_48);
      cmAlphaNum::cmAlphaNum(&local_228,'_');
      args = cmSourceFile::GetExtension_abi_cxx11_(muf->SF);
      cmStrCat<std::__cxx11::string>(&local_1c8,&local_1f8,&local_228,args);
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      cmAlphaNum::cmAlphaNum(&local_278,(string *)local_48);
      cmAlphaNum::cmAlphaNum(&local_2a8,".cpp");
      cmStrCat<>(&local_248,&local_278,&local_2a8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      pVar2 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<std::__cxx11::string&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->Moc).EmittedBuildPaths,__return_storage_ptr__);
      number_begin = (size_t)pVar2.first.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur;
      local_2c0 = pVar2.second;
      local_2b8._M_cur = (__node_type *)number_begin;
      local_2b0 = local_2c0;
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        number_end = 2;
        ii = 0x100;
        for (local_2e0 = 2; local_2e0 != 0x100; local_2e0 = local_2e0 + 1) {
          cmAlphaNum::cmAlphaNum(&local_330,(string *)local_48);
          cmAlphaNum::cmAlphaNum(&local_360,'_');
          cmStrCat<unsigned_long,char[5]>
                    (&local_300,&local_330,&local_360,&local_2e0,(char (*) [5])0xe280ca);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          pVar2 = std::
                  unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::emplace<std::__cxx11::string&>
                            ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&(this->Moc).EmittedBuildPaths,__return_storage_ptr__);
          local_380._M_cur =
               (__node_type *)
               pVar2.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          local_378 = pVar2.second;
          local_370._M_cur = local_380._M_cur;
          local_368 = local_378;
          if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_0082b3e5;
        }
        cmAlphaNum::cmAlphaNum(&local_3d0,"moc output file name conflict for ");
        cmAlphaNum::cmAlphaNum(&local_400,&muf->FullPath);
        cmStrCat<>(&local_3a0,&local_3d0,&local_400);
        cmSystemTools::Error(&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
      }
    }
LAB_0082b3e5:
    basePath.field_2._M_local_buf[0xf] = '\x01';
    basePath.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  if ((basePath.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::GetMocBuildPath(MUFile const& muf)
{
  std::string res;
  if (!muf.MocIt) {
    return res;
  }

  std::string basePath =
    cmStrCat(this->PathCheckSum.getPart(muf.FullPath), "/moc_",
             FileNameWithoutLastExtension(muf.FullPath));

  res = cmStrCat(basePath, ".cpp");
  if (this->Moc.EmittedBuildPaths.emplace(res).second) {
    return res;
  }

  // File name already emitted.
  // Try appending the header suffix to the base path.
  basePath = cmStrCat(basePath, '_', muf.SF->GetExtension());
  res = cmStrCat(basePath, ".cpp");
  if (this->Moc.EmittedBuildPaths.emplace(res).second) {
    return res;
  }

  // File name with header extension already emitted.
  // Try adding a number to the base path.
  constexpr std::size_t number_begin = 2;
  constexpr std::size_t number_end = 256;
  for (std::size_t ii = number_begin; ii != number_end; ++ii) {
    res = cmStrCat(basePath, '_', ii, ".cpp");
    if (this->Moc.EmittedBuildPaths.emplace(res).second) {
      return res;
    }
  }

  // Output file name conflict (unlikely, but still...)
  cmSystemTools::Error(
    cmStrCat("moc output file name conflict for ", muf.FullPath));

  return res;
}